

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall capnp::DynamicValue::Reader::Reader(Reader *this,ConstSchema constant)

{
  bool value_00;
  int8_t value_01;
  uint8_t value_02;
  Which WVar1;
  int16_t value_03;
  uint16_t uVar2;
  int32_t value_04;
  uint32_t value_05;
  int64_t value_06;
  uint64_t value_07;
  float value_08;
  double value_09;
  DynamicEnum value_10;
  Fault local_710;
  Fault f;
  Reader local_6e8;
  Type local_6a0;
  Reader local_690;
  ReaderFor<capnp::DynamicList> local_670;
  Reader local_630;
  Schema local_5e8;
  Reader local_5e0;
  ReaderFor<capnp::DynamicStruct> local_5c0;
  Reader local_588;
  Schema local_540;
  undefined1 local_538 [12];
  Reader local_528;
  ArrayPtr<const_unsigned_char> local_4e0;
  Reader local_4d0;
  ArrayPtr<const_char> local_488;
  Reader local_478;
  Reader local_430;
  Reader local_3e8;
  Reader local_3a0;
  Reader local_358;
  Reader local_310;
  Reader local_2c8;
  Reader local_280;
  Reader local_238;
  Reader local_1f0;
  Reader local_1a8;
  Reader local_160;
  Reader local_100;
  Reader local_b8;
  Reader local_88;
  undefined1 local_58 [8];
  Reader value;
  Type type;
  Reader *this_local;
  ConstSchema constant_local;
  
  this->type = VOID;
  this_local = (Reader *)constant.super_Schema.raw;
  join_0x00000010_0x00000000_ = ConstSchema::getType((ConstSchema *)&this_local);
  Schema::getProto(&local_b8,(Schema *)&this_local);
  capnp::schema::Node::Reader::getConst(&local_88,&local_b8);
  capnp::schema::Node::Const::Reader::getValue((Reader *)local_58,&local_88);
  WVar1 = capnp::Type::which((Type *)&value._reader.nestingLimit);
  switch(WVar1) {
  case VOID:
    Reader();
    operator=(this,&local_100);
    ~Reader(&local_100);
    break;
  case BOOL:
    value_00 = capnp::schema::Value::Reader::getBool((Reader *)local_58);
    Reader(&local_160,value_00);
    operator=(this,&local_160);
    ~Reader(&local_160);
    break;
  case INT8:
    value_01 = capnp::schema::Value::Reader::getInt8((Reader *)local_58);
    Reader(&local_1a8,value_01);
    operator=(this,&local_1a8);
    ~Reader(&local_1a8);
    break;
  case INT16:
    value_03 = capnp::schema::Value::Reader::getInt16((Reader *)local_58);
    Reader(&local_1f0,value_03);
    operator=(this,&local_1f0);
    ~Reader(&local_1f0);
    break;
  case INT32:
    value_04 = capnp::schema::Value::Reader::getInt32((Reader *)local_58);
    Reader(&local_238,value_04);
    operator=(this,&local_238);
    ~Reader(&local_238);
    break;
  case INT64:
    value_06 = capnp::schema::Value::Reader::getInt64((Reader *)local_58);
    Reader(&local_280,value_06);
    operator=(this,&local_280);
    ~Reader(&local_280);
    break;
  case UINT8:
    value_02 = capnp::schema::Value::Reader::getUint8((Reader *)local_58);
    Reader(&local_2c8,value_02);
    operator=(this,&local_2c8);
    ~Reader(&local_2c8);
    break;
  case UINT16:
    uVar2 = capnp::schema::Value::Reader::getUint16((Reader *)local_58);
    Reader(&local_310,uVar2);
    operator=(this,&local_310);
    ~Reader(&local_310);
    break;
  case UINT32:
    value_05 = capnp::schema::Value::Reader::getUint32((Reader *)local_58);
    Reader(&local_358,value_05);
    operator=(this,&local_358);
    ~Reader(&local_358);
    break;
  case UINT64:
    value_07 = capnp::schema::Value::Reader::getUint64((Reader *)local_58);
    Reader(&local_3a0,value_07);
    operator=(this,&local_3a0);
    ~Reader(&local_3a0);
    break;
  case FLOAT32:
    value_08 = capnp::schema::Value::Reader::getFloat32((Reader *)local_58);
    Reader(&local_3e8,value_08);
    operator=(this,&local_3e8);
    ~Reader(&local_3e8);
    break;
  case FLOAT64:
    value_09 = capnp::schema::Value::Reader::getFloat64((Reader *)local_58);
    Reader(&local_430,value_09);
    operator=(this,&local_430);
    ~Reader(&local_430);
    break;
  case TEXT:
    local_488 = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText((Reader *)local_58);
    Reader(&local_478,(Reader *)&local_488);
    operator=(this,&local_478);
    ~Reader(&local_478);
    break;
  case DATA:
    local_4e0 = (ArrayPtr<const_unsigned_char>)
                capnp::schema::Value::Reader::getData((Reader *)local_58);
    Reader(&local_4d0,(Reader *)&local_4e0);
    operator=(this,&local_4d0);
    ~Reader(&local_4d0);
    break;
  case LIST:
    capnp::schema::Value::Reader::getList(&local_690,(Reader *)local_58);
    local_6a0 = (Type)capnp::Type::asList((Type *)&value._reader.nestingLimit);
    AnyPointer::Reader::getAs<capnp::DynamicList>(&local_670,&local_690,(ListSchema)local_6a0);
    Reader(&local_630,&local_670);
    operator=(this,&local_630);
    ~Reader(&local_630);
    break;
  case ENUM:
    local_540.raw = (RawBrandedSchema *)capnp::Type::asEnum((Type *)&value._reader.nestingLimit);
    uVar2 = capnp::schema::Value::Reader::getEnum((Reader *)local_58);
    DynamicEnum::DynamicEnum((DynamicEnum *)local_538,(EnumSchema)local_540.raw,uVar2);
    value_10._12_4_ = 0;
    value_10.schema.super_Schema.raw = (Schema)(Schema)local_538._0_8_;
    value_10.value = local_538._8_2_;
    value_10._10_2_ = local_538._10_2_;
    Reader(&local_528,value_10);
    operator=(this,&local_528);
    ~Reader(&local_528);
    break;
  case STRUCT:
    capnp::schema::Value::Reader::getStruct(&local_5e0,(Reader *)local_58);
    local_5e8.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)&value._reader.nestingLimit);
    AnyPointer::Reader::getAs<capnp::DynamicStruct>
              (&local_5c0,&local_5e0,(StructSchema)local_5e8.raw);
    Reader(&local_588,&local_5c0);
    operator=(this,&local_588);
    ~Reader(&local_588);
    break;
  case INTERFACE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              (&local_710,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x5bc,FAILED,(char *)0x0,"\"Constants can\'t have interface type.\"",
               (char (*) [37])"Constants can\'t have interface type.");
    kj::_::Debug::Fault::fatal(&local_710);
  case ANY_POINTER:
    capnp::schema::Value::Reader::getAnyPointer((Reader *)&f,(Reader *)local_58);
    Reader(&local_6e8,(Reader *)&f);
    operator=(this,&local_6e8);
    ~Reader(&local_6e8);
  }
  return;
}

Assistant:

DynamicValue::Reader::Reader(ConstSchema constant): type(VOID) {
  auto type = constant.getType();
  auto value = constant.getProto().getConst().getValue();
  switch (type.which()) {
    case schema::Type::VOID: *this = capnp::VOID; break;
    case schema::Type::BOOL: *this = value.getBool(); break;
    case schema::Type::INT8: *this = value.getInt8(); break;
    case schema::Type::INT16: *this = value.getInt16(); break;
    case schema::Type::INT32: *this = value.getInt32(); break;
    case schema::Type::INT64: *this = value.getInt64(); break;
    case schema::Type::UINT8: *this = value.getUint8(); break;
    case schema::Type::UINT16: *this = value.getUint16(); break;
    case schema::Type::UINT32: *this = value.getUint32(); break;
    case schema::Type::UINT64: *this = value.getUint64(); break;
    case schema::Type::FLOAT32: *this = value.getFloat32(); break;
    case schema::Type::FLOAT64: *this = value.getFloat64(); break;
    case schema::Type::TEXT: *this = value.getText(); break;
    case schema::Type::DATA: *this = value.getData(); break;

    case schema::Type::ENUM:
      *this = DynamicEnum(type.asEnum(), value.getEnum());
      break;

    case schema::Type::STRUCT:
      *this = value.getStruct().getAs<DynamicStruct>(type.asStruct());
      break;

    case schema::Type::LIST:
      *this = value.getList().getAs<DynamicList>(type.asList());
      break;

    case schema::Type::ANY_POINTER:
      *this = value.getAnyPointer();
      break;

    case schema::Type::INTERFACE:
      KJ_FAIL_ASSERT("Constants can't have interface type.");
  }
}